

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O1

int __thiscall CaDiCaL::Internal::lucky_phases(Internal *this)

{
  anon_struct_80_6_ef6df081_for_lucky *paVar1;
  int64_t *piVar2;
  Internal *pIVar3;
  int iVar4;
  int iVar5;
  Profile *in_RSI;
  Profile *pPVar6;
  Profile *__timer;
  double s;
  double s_00;
  double s_01;
  double s_02;
  
  iVar5 = 0;
  if (((((this->opts).lucky != 0) &&
       ((this->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish)) &&
      ((this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) && (iVar5 = 0, this->external_prop == false)) {
    pIVar3 = this->internal;
    pPVar6 = in_RSI;
    if ((pIVar3->profiles).search.level <= (pIVar3->opts).profile) {
      pPVar6 = &(pIVar3->profiles).search;
      time(pIVar3,(time_t *)in_RSI);
      start_profiling(pIVar3,pPVar6,s);
    }
    pIVar3 = this->internal;
    if ((pIVar3->profiles).lucky.level <= (pIVar3->opts).profile) {
      time(pIVar3,(time_t *)pPVar6);
      start_profiling(pIVar3,&(pIVar3->profiles).lucky,s_00);
    }
    this->searching_lucky_phases = true;
    paVar1 = &(this->stats).lucky;
    paVar1->tried = paVar1->tried + 1;
    iVar4 = trivially_false_satisfiable(this);
    if (iVar4 == 0) {
      iVar4 = trivially_true_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = forward_true_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = forward_false_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = backward_false_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = backward_true_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = positive_horn_satisfiable(this);
    }
    if (iVar4 == 0) {
      iVar4 = negative_horn_satisfiable(this);
    }
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar4 == 10) {
      piVar2 = &(this->stats).lucky.succeeded;
      *piVar2 = *piVar2 + 1;
    }
    __timer = (Profile *)0x6c;
    report(this,'l',(uint)(iVar4 < 1));
    this->searching_lucky_phases = false;
    pIVar3 = this->internal;
    pPVar6 = __timer;
    if ((pIVar3->profiles).lucky.level <= (pIVar3->opts).profile) {
      pPVar6 = &(pIVar3->profiles).lucky;
      time(pIVar3,(time_t *)__timer);
      stop_profiling(pIVar3,pPVar6,s_01);
    }
    pIVar3 = this->internal;
    if ((pIVar3->profiles).search.level <= (pIVar3->opts).profile) {
      time(pIVar3,(time_t *)pPVar6);
      stop_profiling(pIVar3,&(pIVar3->profiles).search,s_02);
    }
  }
  return iVar5;
}

Assistant:

int Internal::lucky_phases () {
  assert (!level);
  require_mode (SEARCH);
  if (!opts.lucky)
    return 0;

  // TODO: Some of the lucky assignments can also be found if there are
  // assumptions, but this is not completely implemented nor tested yet.
  // Nothing done for constraint either.
  // External propagator assumes a CDCL loop, so lucky is not tried here.
  if (!assumptions.empty () || !constraint.empty () || external_prop)
    return 0;

  START (search);
  START (lucky);
  assert (!searching_lucky_phases);
  searching_lucky_phases = true;
  stats.lucky.tried++;
  int res = trivially_false_satisfiable ();
  if (!res)
    res = trivially_true_satisfiable ();
  if (!res)
    res = forward_true_satisfiable ();
  if (!res)
    res = forward_false_satisfiable ();
  if (!res)
    res = backward_false_satisfiable ();
  if (!res)
    res = backward_true_satisfiable ();
  if (!res)
    res = positive_horn_satisfiable ();
  if (!res)
    res = negative_horn_satisfiable ();
  if (res < 0)
    assert (termination_forced), res = 0;
  if (res == 10)
    stats.lucky.succeeded++;
  report ('l', !res);
  assert (searching_lucky_phases);
  searching_lucky_phases = false;
  STOP (lucky);
  STOP (search);

  return res;
}